

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_gej_rescale(secp256k1_gej *r,secp256k1_fe *s)

{
  secp256k1_fe *r_00;
  int iVar1;
  secp256k1_fe zz;
  secp256k1_fe local_50;
  
  secp256k1_gej_verify(r);
  secp256k1_fe_verify(s);
  iVar1 = secp256k1_fe_normalizes_to_zero_var(s);
  if (iVar1 == 0) {
    secp256k1_fe_sqr(&local_50,s);
    secp256k1_fe_mul(&r->x,&r->x,&local_50);
    r_00 = &r->y;
    secp256k1_fe_mul(r_00,r_00,&local_50);
    secp256k1_fe_mul(r_00,r_00,s);
    secp256k1_fe_mul(&r->z,&r->z,s);
    secp256k1_gej_verify(r);
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/group_impl.h"
          ,0x362,"test condition failed: !secp256k1_fe_normalizes_to_zero_var(s)");
  abort();
}

Assistant:

static void secp256k1_gej_rescale(secp256k1_gej *r, const secp256k1_fe *s) {
    /* Operations: 4 mul, 1 sqr */
    secp256k1_fe zz;
    SECP256K1_GEJ_VERIFY(r);
    SECP256K1_FE_VERIFY(s);
    VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(s));

    secp256k1_fe_sqr(&zz, s);
    secp256k1_fe_mul(&r->x, &r->x, &zz);                /* r->x *= s^2 */
    secp256k1_fe_mul(&r->y, &r->y, &zz);
    secp256k1_fe_mul(&r->y, &r->y, s);                  /* r->y *= s^3 */
    secp256k1_fe_mul(&r->z, &r->z, s);                  /* r->z *= s   */

    SECP256K1_GEJ_VERIFY(r);
}